

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * anon_unknown.dwarf_107107::CreatePhi
                    (VmModule *module,SynBase *source,VmInstruction *valueA,VmInstruction *valueB)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  VmValue *in_RAX;
  VmInstruction *pVVar5;
  int iVar6;
  undefined1 auVar7 [16];
  VmType type;
  
  if (valueA == (VmInstruction *)0x0) {
    __assert_fail("valueA",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x33f,
                  "VmValue *(anonymous namespace)::CreatePhi(VmModule *, SynBase *, VmInstruction *, VmInstruction *)"
                 );
  }
  if (valueB != (VmInstruction *)0x0) {
    uVar1 = (valueA->super_VmValue).type.type;
    uVar3 = (valueA->super_VmValue).type.size;
    uVar2 = (valueB->super_VmValue).type.type;
    uVar4 = (valueB->super_VmValue).type.size;
    auVar7._4_4_ = -(uint)(uVar2 == uVar1);
    auVar7._0_4_ = -(uint)(uVar2 == uVar1);
    auVar7._8_4_ = -(uint)(uVar4 == uVar3);
    auVar7._12_4_ = -(uint)(uVar4 == uVar3);
    iVar6 = movmskpd((int)valueB,auVar7);
    if (iVar6 == 3) {
      type.structType = (TypeBase *)0x4d;
      type._0_8_ = (valueA->super_VmValue).type.structType;
      pVVar5 = CreateInstruction((anon_unknown_dwarf_107107 *)module,(VmModule *)source,
                                 *(SynBase **)&(valueA->super_VmValue).type,type,
                                 (VmInstructionType)valueA,&valueA->parent->super_VmValue,
                                 &valueB->super_VmValue,&valueB->parent->super_VmValue,
                                 (VmValue *)0x0,in_RAX);
      return &pVVar5->super_VmValue;
    }
    __assert_fail("valueA->type == valueB->type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x341,
                  "VmValue *(anonymous namespace)::CreatePhi(VmModule *, SynBase *, VmInstruction *, VmInstruction *)"
                 );
  }
  __assert_fail("valueB",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x340,
                "VmValue *(anonymous namespace)::CreatePhi(VmModule *, SynBase *, VmInstruction *, VmInstruction *)"
               );
}

Assistant:

VmValue* CreatePhi(VmModule *module, SynBase *source, VmInstruction *valueA, VmInstruction *valueB)
	{
		assert(valueA);
		assert(valueB);
		assert(valueA->type == valueB->type);

		return CreateInstruction(module, source, valueA->type, VM_INST_PHI, valueA, valueA->parent, valueB, valueB->parent);
	}